

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_private.h
# Opt level: O0

uint32_t amqp_d32(void *data)

{
  int iVar1;
  uint *in_RDI;
  uint32_t val;
  undefined4 local_c;
  
  local_c = *in_RDI;
  iVar1 = is_bigendian();
  if (iVar1 == 0) {
    local_c = local_c >> 0x18 | (local_c & 0xff0000) >> 8 | (local_c & 0xff00) << 8 |
              local_c << 0x18;
  }
  return local_c;
}

Assistant:

static inline uint32_t amqp_d32(void *data) {
  uint32_t val;
  memcpy(&val, data, sizeof(val));
  if (!is_bigendian()) {
    val = ((val & 0xFF000000u) >> 24u) | ((val & 0x00FF0000u) >> 8u) |
          ((val & 0x0000FF00u) << 8u) | ((val & 0x000000FFu) << 24u);
  }
  return val;
}